

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

string * google::protobuf::StrCat_abi_cxx11_(AlphaNum *a,AlphaNum *b,AlphaNum *c)

{
  size_t sVar1;
  char *out_00;
  AlphaNum *x2;
  AlphaNum *x1;
  AlphaNum *in_RCX;
  AlphaNum *in_RDX;
  AlphaNum *in_RSI;
  string *in_RDI;
  char *out;
  char *begin;
  string *result;
  AlphaNum *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  reference local_40;
  undefined1 local_21;
  AlphaNum *local_20;
  AlphaNum *local_18;
  AlphaNum *local_10;
  
  local_21 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  sVar1 = strings::AlphaNum::size(local_10);
  out_00 = (char *)strings::AlphaNum::size(local_18);
  x2 = (AlphaNum *)(out_00 + sVar1);
  x1 = (AlphaNum *)strings::AlphaNum::size(local_20);
  std::__cxx11::string::resize((ulong)in_RDI);
  local_48._M_current = (char *)std::__cxx11::string::begin();
  local_40 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_48);
  Append2(out_00,x1,x2);
  Append1(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  return in_RDI;
}

Assistant:

string StrCat(const AlphaNum &a, const AlphaNum &b, const AlphaNum &c) {
  string result;
  result.resize(a.size() + b.size() + c.size());
  char *const begin = &*result.begin();
  char *out = Append2(begin, a, b);
  out = Append1(out, c);
  GOOGLE_DCHECK_EQ(out, begin + result.size());
  return result;
}